

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error
adios2_set_step_selection(adios2_variable *variable,size_t step_start,size_t step_count)

{
  size_t local_58;
  size_t local_50;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,"for adios2_variable, in call to adios2_set_step_selection",
             (allocator *)&local_58);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_58 = step_start;
  local_50 = step_count;
  adios2::core::VariableBase::SetStepSelection((pair *)variable);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_step_selection(adios2_variable *variable, const size_t step_start,
                                       const size_t step_count)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_step_selection");
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetStepSelection(adios2::Box<size_t>{step_start, step_count});
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_selection"));
    }
}